

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromosome.h
# Opt level: O2

Chromosome * __thiscall
tsp::Chromosome::crossover
          (Chromosome *__return_storage_ptr__,Chromosome *this,Chromosome *chromosome,uint pcross)

{
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar1;
  pointer piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  int *piVar4;
  ulong uVar5;
  int *piVar6;
  ulong uVar7;
  ulong __new_size;
  value_type value;
  int local_3c;
  Chromosome *local_38;
  
  local_38 = chromosome;
  Chromosome(__return_storage_ptr__);
  __new_size = (long)(this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
  this_00 = &__return_storage_ptr__->values;
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
  piVar6 = (__return_storage_ptr__->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar1 = (__return_storage_ptr__->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (piVar4 = piVar1; piVar4 != piVar6; piVar4 = piVar4 + 1) {
    *piVar4 = 0;
  }
  piVar2 = (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (ulong)pcross;
  for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    piVar1[uVar5] = piVar2[uVar5];
  }
  while ((ulong)(long)(int)pcross < __new_size) {
    local_3c = (local_38->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7 % __new_size];
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start,piVar6,&local_3c);
    piVar6 = (__return_storage_ptr__->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (_Var3._M_current == piVar6) {
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[(int)pcross] = local_3c;
      pcross = pcross + 1;
    }
    uVar7 = uVar7 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Chromosome Chromosome::crossover(const Chromosome &chromosome, unsigned int pcross) {
        Chromosome child = Chromosome();

        auto size = this->values.size();
        child.values.resize(size);

        std::fill(child.values.begin(), child.values.end(), 0);

        int indexC = 0;
        int indexP = 0;

        for (indexP = 0; indexP < pcross; ++indexP) {
            child.values[indexC] = this->values[indexP];
            ++indexC;
        }

        while (indexC < size) {
            auto value = chromosome.values[indexP % size];
            auto it = std::find(child.values.begin(), child.values.end(), value);

            if (it == child.values.end()) {
                child.values[indexC] = value;
                ++indexC;
            }

            ++indexP;
        }

        return child;
    }